

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayDropSchema(WriteAheadLogDeserializer *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  DropInfo info;
  
  DropInfo::DropInfo(&info);
  info.super_ParseInfo._9_1_ = 2;
  Deserializer::ReadProperty<std::__cxx11::string>
            (&local_b0,&(this->deserializer).super_Deserializer,0x65,"schema");
  ::std::__cxx11::string::operator=((string *)&info.name,(string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  if (this->deserialize_only == false) {
    Catalog::DropEntry(this->catalog,this->context,&info);
  }
  DropInfo::~DropInfo(&info);
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayDropSchema() {
	DropInfo info;

	info.type = CatalogType::SCHEMA_ENTRY;
	info.name = deserializer.ReadProperty<string>(101, "schema");
	if (DeserializeOnly()) {
		return;
	}

	catalog.DropEntry(context, info);
}